

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_peer.cpp
# Opt level: O2

uint32_t __thiscall
libtorrent::aux::torrent_peer::rank(torrent_peer *this,external_ip *external,int external_port)

{
  uint32_t uVar1;
  endpoint local_c0;
  endpoint local_a4;
  address local_88;
  address local_68;
  address local_48;
  
  if (this->peer_rank != 0) {
    return this->peer_rank;
  }
  address(this);
  external_ip::external_address(&local_48,external,&local_68);
  boost::asio::ip::detail::endpoint::endpoint(&local_a4,&local_48,(unsigned_short)external_port);
  address(this);
  boost::asio::ip::detail::endpoint::endpoint(&local_c0,&local_88,this->port);
  uVar1 = peer_priority((endpoint *)&local_a4,(endpoint *)&local_c0);
  this->peer_rank = uVar1;
  return uVar1;
}

Assistant:

std::uint32_t torrent_peer::rank(aux::external_ip const& external, int external_port) const
	{
		TORRENT_ASSERT(in_use);
		//TODO: how do we deal with our external address changing?
		if (peer_rank == 0)
			peer_rank = peer_priority(
				tcp::endpoint(external.external_address(this->address()), std::uint16_t(external_port))
				, tcp::endpoint(this->address(), this->port));
		return peer_rank;
	}